

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O1

int arguments_choose(dmr_C *C,expression *expr)

{
  expression *expr_00;
  symbol *psVar1;
  char *fmt;
  position pos;
  uint uVar2;
  undefined1 local_40 [8];
  ptr_list_iter argiter__;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_40,(ptr_list *)(expr->field_5).field_2.string);
  expr_00 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_40);
  uVar2 = 0;
  while (expr_00 != (expression *)0x0) {
    psVar1 = dmrC_evaluate_expression(C,expr_00);
    if (psVar1 == (symbol *)0x0) {
      return 0;
    }
    uVar2 = uVar2 + 1;
    expr_00 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_40);
  }
  if (uVar2 < 3) {
    pos = expr->pos;
    fmt = "not enough arguments for __builtin_choose_expr";
  }
  else {
    if (uVar2 == 3) {
      return 1;
    }
    pos = expr->pos;
    fmt = "too many arguments for __builtin_choose_expr";
  }
  dmrC_sparse_error(C,pos,fmt);
  return 0;
}

Assistant:

static int arguments_choose(struct dmr_C *C, struct expression *expr)
{
	struct expression_list *arglist = expr->args;
	struct expression *arg;
	int i = 0;

	FOR_EACH_PTR (arglist, arg) {
		if (!dmrC_evaluate_expression(C, arg))
			return 0;
		i++;
	} END_FOR_EACH_PTR(arg);
	if (i < 3) {
		dmrC_sparse_error(C, expr->pos,
			     "not enough arguments for __builtin_choose_expr");
		return 0;
	} if (i > 3) {
		dmrC_sparse_error(C, expr->pos,
			     "too many arguments for __builtin_choose_expr");
		return 0;
	}
	return 1;
}